

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O1

ARKODE_DIRKTableID arkButcherTableDIRKNameToID(char *imethod)

{
  int iVar1;
  ARKODE_DIRKTableID AVar2;
  
  iVar1 = strcmp("ARKODE_DIRK_NONE",imethod);
  AVar2 = ARKODE_DIRK_NONE;
  if (iVar1 != 0) {
    iVar1 = strcmp("ARKODE_BACKWARD_EULER_1_1",imethod);
    if (iVar1 == 0) {
      AVar2 = ARKODE_BACKWARD_EULER_1_1;
    }
    else {
      iVar1 = strcmp("ARKODE_SDIRK_2_1_2",imethod);
      if (iVar1 == 0) {
        AVar2 = ARKODE_MIN_DIRK_NUM;
      }
      else {
        iVar1 = strcmp("ARKODE_ARK2_DIRK_3_1_2",imethod);
        if (iVar1 == 0) {
          AVar2 = ARKODE_ARK2_DIRK_3_1_2;
        }
        else {
          iVar1 = strcmp("ARKODE_IMPLICIT_MIDPOINT_1_2",imethod);
          if (iVar1 == 0) {
            AVar2 = ARKODE_IMPLICIT_MIDPOINT_1_2;
          }
          else {
            iVar1 = strcmp("ARKODE_IMPLICIT_TRAPEZOIDAL_2_2",imethod);
            if (iVar1 == 0) {
              AVar2 = ARKODE_IMPLICIT_TRAPEZOIDAL_2_2;
            }
            else {
              iVar1 = strcmp("ARKODE_BILLINGTON_3_3_2",imethod);
              if (iVar1 == 0) {
                AVar2 = ARKODE_BILLINGTON_3_3_2;
              }
              else {
                iVar1 = strcmp("ARKODE_TRBDF2_3_3_2",imethod);
                if (iVar1 == 0) {
                  AVar2 = ARKODE_TRBDF2_3_3_2;
                }
                else {
                  iVar1 = strcmp("ARKODE_KVAERNO_4_2_3",imethod);
                  if (iVar1 == 0) {
                    AVar2 = ARKODE_KVAERNO_4_2_3;
                  }
                  else {
                    iVar1 = strcmp("ARKODE_ARK324L2SA_DIRK_4_2_3",imethod);
                    if (iVar1 == 0) {
                      AVar2 = ARKODE_ARK324L2SA_DIRK_4_2_3;
                    }
                    else {
                      iVar1 = strcmp("ARKODE_CASH_5_2_4",imethod);
                      if (iVar1 == 0) {
                        AVar2 = ARKODE_CASH_5_2_4;
                      }
                      else {
                        iVar1 = strcmp("ARKODE_CASH_5_3_4",imethod);
                        if (iVar1 == 0) {
                          AVar2 = ARKODE_CASH_5_3_4;
                        }
                        else {
                          iVar1 = strcmp("ARKODE_SDIRK_5_3_4",imethod);
                          if (iVar1 == 0) {
                            AVar2 = ARKODE_SDIRK_5_3_4;
                          }
                          else {
                            iVar1 = strcmp("ARKODE_KVAERNO_5_3_4",imethod);
                            if (iVar1 == 0) {
                              AVar2 = ARKODE_KVAERNO_5_3_4;
                            }
                            else {
                              iVar1 = strcmp("ARKODE_ARK436L2SA_DIRK_6_3_4",imethod);
                              if (iVar1 == 0) {
                                AVar2 = ARKODE_ARK436L2SA_DIRK_6_3_4;
                              }
                              else {
                                iVar1 = strcmp("ARKODE_ARK437L2SA_DIRK_7_3_4",imethod);
                                if (iVar1 == 0) {
                                  AVar2 = ARKODE_ARK437L2SA_DIRK_7_3_4;
                                }
                                else {
                                  iVar1 = strcmp("ARKODE_KVAERNO_7_4_5",imethod);
                                  if (iVar1 == 0) {
                                    AVar2 = ARKODE_KVAERNO_7_4_5;
                                  }
                                  else {
                                    iVar1 = strcmp("ARKODE_ARK548L2SA_DIRK_8_4_5",imethod);
                                    if (iVar1 == 0) {
                                      AVar2 = ARKODE_ARK548L2SA_DIRK_8_4_5;
                                    }
                                    else {
                                      iVar1 = strcmp("ARKODE_ARK548L2SAb_DIRK_8_4_5",imethod);
                                      if (iVar1 == 0) {
                                        AVar2 = ARKODE_ARK548L2SAb_DIRK_8_4_5;
                                      }
                                      else {
                                        iVar1 = strcmp("ARKODE_ESDIRK324L2SA_4_2_3",imethod);
                                        if (iVar1 == 0) {
                                          AVar2 = ARKODE_ESDIRK324L2SA_4_2_3;
                                        }
                                        else {
                                          iVar1 = strcmp("ARKODE_ESDIRK325L2SA_5_2_3",imethod);
                                          if (iVar1 == 0) {
                                            AVar2 = ARKODE_ESDIRK325L2SA_5_2_3;
                                          }
                                          else {
                                            iVar1 = strcmp("ARKODE_ESDIRK32I5L2SA_5_2_3",imethod);
                                            if (iVar1 == 0) {
                                              AVar2 = ARKODE_ESDIRK32I5L2SA_5_2_3;
                                            }
                                            else {
                                              iVar1 = strcmp("ARKODE_ESDIRK436L2SA_6_3_4",imethod);
                                              if (iVar1 == 0) {
                                                AVar2 = ARKODE_ESDIRK436L2SA_6_3_4;
                                              }
                                              else {
                                                iVar1 = strcmp("ARKODE_ESDIRK43I6L2SA_6_3_4",imethod
                                                              );
                                                if (iVar1 == 0) {
                                                  AVar2 = ARKODE_ESDIRK43I6L2SA_6_3_4;
                                                }
                                                else {
                                                  iVar1 = strcmp("ARKODE_QESDIRK436L2SA_6_3_4",
                                                                 imethod);
                                                  if (iVar1 == 0) {
                                                    AVar2 = ARKODE_QESDIRK436L2SA_6_3_4;
                                                  }
                                                  else {
                                                    iVar1 = strcmp("ARKODE_ESDIRK437L2SA_7_3_4",
                                                                   imethod);
                                                    if (iVar1 == 0) {
                                                      AVar2 = ARKODE_ESDIRK437L2SA_7_3_4;
                                                    }
                                                    else {
                                                      iVar1 = strcmp("ARKODE_ESDIRK547L2SA_7_4_5",
                                                                     imethod);
                                                      if (iVar1 == 0) {
                                                        AVar2 = ARKODE_ESDIRK547L2SA_7_4_5;
                                                      }
                                                      else {
                                                        iVar1 = strcmp("ARKODE_ESDIRK547L2SA2_7_4_5"
                                                                       ,imethod);
                                                        if (iVar1 == 0) {
                                                          AVar2 = ARKODE_ESDIRK547L2SA2_7_4_5;
                                                        }
                                                        else {
                                                          arkProcessError((ARKodeMem)0x0,-0x16,0x5c,
                                                                                                                                                    
                                                  "arkButcherTableDIRKNameToID",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_butcher_dirk.c"
                                                  ,"Unknown Butcher table");
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return AVar2;
}

Assistant:

ARKODE_DIRKTableID arkButcherTableDIRKNameToID(const char* imethod)
{
  /* Use X-macro to test each method name */
#define ARK_BUTCHER_TABLE(name, coeff) \
  if (strcmp(#name, imethod) == 0) { return name; }
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown Butcher table");

  return ARKODE_DIRK_NONE;
}